

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Text.c
# Opt level: O0

uint8_t * plot_single_glyph(tgestate_t *state,int character,uint8_t *output)

{
  tilerow_t *in_RDX;
  int in_ESI;
  uint8_t *in_RDI;
  uint8_t *saved_output;
  int iters;
  tilerow_t *row;
  tile_t *glyph;
  int local_2c;
  tilerow_t *local_28;
  tilerow_t *local_18;
  int in_stack_fffffffffffffff0;
  
  local_2c = 8;
  local_28 = bitmap_font["%%%%%%%%%%%%%%%%%%%%%%%%%%%%%%%%#%%%%%%%%%%%%%$%"[in_ESI]].row;
  local_18 = in_RDX;
  do {
    *local_18 = *local_28;
    local_18 = local_18 + 0x100;
    local_2c = local_2c + -1;
    local_28 = local_28 + 1;
  } while (local_2c != 0);
  invalidate_bitmap((tgestate_t *)saved_output,in_RDI,in_ESI,in_stack_fffffffffffffff0);
  return in_RDX + 1;
}

Assistant:

uint8_t *plot_single_glyph(tgestate_t *state, int character, uint8_t *output)
{
  const tile_t    *glyph;        /* was HL */
  const tilerow_t *row;          /* was HL */
  int              iters;        /* was B */
  uint8_t         *saved_output; /* was stacked */

  assert(character < 256);
  assert(output != NULL);

  glyph        = &bitmap_font[ascii_to_font[character]];
  row          = &glyph->row[0];
  saved_output = output;

  iters = 8;
  do
  {
    *output = *row++;
    output += 256; /* Advance to next row. */
  }
  while (--iters);

  /* Conv: Invalidation added over the original game. */
  invalidate_bitmap(state, saved_output, 8, 8);

  /* Return the position of the next character. */
  return ++saved_output;
}